

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O3

string * gmlc::networking::getLocalExternalAddressV6(string *__return_storage_ptr__,string *server)

{
  undefined8 *puVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int family;
  undefined1 *puVar4;
  ulong uVar5;
  long lVar6;
  undefined1 *puVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ndef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidate_addresses;
  string sstring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resolved_addresses;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  query query;
  query query_server;
  resolver resolver;
  string local_270;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  string *local_248;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type sStack_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined1 local_1d0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_168 [2];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 local_108;
  size_type sStack_100;
  undefined1 local_f0 [48];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_f0._0_8_ = local_f0 + 0x10;
  AsioContextManager::getContextPointer((AsioContextManager *)local_1d0,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_1d0._0_8_ + 0x40));
  local_218._M_dataplus._M_p._0_4_ = 10;
  local_178._0_8_ = aaStack_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_f0,(protocol_type *)&local_218,server,
             (string *)local_178,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ != aaStack_168) {
    operator_delete((void *)local_178._0_8_,aaStack_168[0]._M_allocated_capacity + 1);
  }
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)local_178,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,(query *)local_f0);
  local_220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
  sVar2 = *(size_type *)local_178._0_8_;
  lVar6 = aaStack_168[0]._M_allocated_capacity * 0x60;
  local_178._4_4_ = *(undefined4 *)(sVar2 + 4 + lVar6);
  puVar1 = (undefined8 *)(sVar2 + 8 + lVar6);
  local_108 = *puVar1;
  sStack_100 = puVar1[1];
  local_178[0] = *(short *)(sVar2 + lVar6) != 2;
  if ((bool)local_178[0]) {
    aaStack_168[0]._8_4_ = *(undefined4 *)(sVar2 + 0x18 + lVar6);
    local_178._4_4_ = 0;
    local_178._8_8_ = local_108;
    aaStack_168[0]._0_8_ = sStack_100;
  }
  else {
    local_178._8_8_ = 0;
    aaStack_168[0]._M_allocated_capacity = 0;
    aaStack_168[0]._8_4_ = 0;
  }
  local_178._1_3_ = 0;
  asio::ip::address::to_string_abi_cxx11_(&local_218,(address *)local_178);
  netif::getInterfaceAddresses_abi_cxx11_(&local_190,(netif *)0xa,family);
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1f8._4_4_,10);
  asio::ip::host_name_abi_cxx11_();
  local_240._0_8_ = &aStack_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_178,(protocol_type *)&local_1f8,&local_270
             ,(string *)local_240,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._0_8_ != &aStack_230) {
    operator_delete((void *)local_240._0_8_,aStack_230._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&local_270,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,(query *)local_178);
  _Var3._M_p = local_270._M_dataplus._M_p;
  local_250 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    lVar6 = local_270.field_2._M_allocated_capacity * 0x60;
    uVar10 = local_270.field_2._M_allocated_capacity;
    local_248 = __return_storage_ptr__;
    while( true ) {
      uVar10 = uVar10 + 1;
      sVar2 = *(size_type *)_Var3._M_p;
      local_240._4_4_ = *(undefined4 *)(sVar2 + 4 + lVar6);
      puVar1 = (undefined8 *)(sVar2 + 8 + lVar6);
      local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar1;
      sStack_1f0 = puVar1[1];
      local_240[0] = *(short *)(sVar2 + lVar6) != 2;
      if ((bool)local_240[0]) {
        aStack_230._8_4_ = *(undefined4 *)(sVar2 + 0x18 + lVar6);
        local_240._4_4_ = 0;
        local_240._8_8_ = local_1f8;
        aStack_230._M_allocated_capacity = sStack_1f0;
      }
      else {
        local_240._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        aStack_230._M_allocated_capacity = 0;
        aStack_230._8_4_ = 0;
      }
      local_240._1_3_ = 0;
      asio::ip::address::to_string_abi_cxx11_(&local_270,(address *)local_240);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if (uVar10 == ((long)(*(long *)(_Var3._M_p + 8) - *(size_type *)_Var3._M_p) >> 5) *
                    -0x5555555555555555) break;
      lVar6 = lVar6 + 0x60;
    }
    if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
    }
    local_250 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__ = local_248;
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_190);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1d0 + 0x10),&local_1e8);
  prioritizeExternalAddresses
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_240,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_1d0 + 0x10));
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1d0 + 0x10));
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  local_248 = (string *)
              &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__)->field_2;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)->
  _M_dataplus)._M_p = (pointer)local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(size_type *)local_240._0_8_,
             *(long *)(local_240._0_8_ + 8) + *(size_type *)local_240._0_8_);
  uVar10 = local_240._8_8_;
  uVar5 = 0;
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)
      ->_M_string_length != 0 && local_218._M_string_length != 0) {
    uVar8 = 0;
    while (*(char *)(CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_) +
                    uVar8) ==
           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__)->_M_dataplus)._M_p[uVar8]) {
      uVar5 = uVar8 + 1;
      if ((local_218._M_string_length - 1 == uVar8) ||
         (bVar11 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__)->_M_string_length - 1 == uVar8, uVar8 = uVar5, bVar11))
      goto LAB_003d24c8;
    }
    uVar5 = uVar8 & 0xffffffff;
  }
LAB_003d24c8:
  if (local_240._0_8_ != local_240._8_8_) {
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_240._0_8_;
    do {
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,paVar9->_M_allocated_capacity,
                 (&paVar9->_M_allocated_capacity)[1] + paVar9->_M_allocated_capacity);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && local_218._M_string_length != 0) {
        puVar7 = (undefined1 *)0x0;
        while (puVar7[CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_)]
               == local_270._M_dataplus._M_p[(long)puVar7]) {
          puVar4 = puVar7 + 1;
          if (((undefined1 *)(local_218._M_string_length - 1) == puVar7) ||
             (bVar11 = (undefined1 *)
                       ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               (local_270._M_string_length + -0x10))->_M_weak_count + 3U) == puVar7,
             puVar7 = puVar4, bVar11)) goto LAB_003d254d;
        }
        puVar4 = (undefined1 *)((ulong)puVar7 & 0xffffffff);
LAB_003d254d:
        if (6 < (int)puVar4 && (int)uVar5 < (int)puVar4) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270)
          ;
          uVar5 = (ulong)puVar4 & 0xffffffff;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar9->_M_allocated_capacity + 4);
    } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)uVar10);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
  }
  this = local_220;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_) !=
      &local_218.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_),
                    local_218.field_2._M_allocated_capacity + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&local_80);
  if ((element_type *)local_1d0._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLocalExternalAddressV6(const std::string& server)
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());

    asio::ip::tcp::resolver::query query_server(
        asio::ip::tcp::v6(), server, "");
    asio::ip::tcp::resolver::iterator it_server =
        resolver.resolve(query_server);
    asio::ip::tcp::endpoint servep = *it_server;
    asio::ip::tcp::resolver::iterator end;

    auto sstring = (it_server == end) ? server : servep.address().to_string();
#else
    std::string sstring = server;
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV6();
    std::vector<std::string> resolved_addresses;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v6(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query);
    // asio::ip::tcp::endpoint endpoint = *it;

    while (it != end) {
        asio::ip::tcp::endpoint ept = *it;
        resolved_addresses.push_back(ept.address().to_string());
        ++it;
    }
#endif
    auto candidate_addresses =
        prioritizeExternalAddresses(interface_addresses, resolved_addresses);

    int cnt = 0;
    std::string def = candidate_addresses[0];
    cnt = matchcount(sstring.begin(), sstring.end(), def.begin(), def.end());
    for (auto ndef : candidate_addresses) {
        auto mcnt = matchcount(
            sstring.begin(), sstring.end(), ndef.begin(), ndef.end());
        if ((mcnt > cnt) && (mcnt >= 7)) {
            def = ndef;
            cnt = mcnt;
        }
    }
    return def;
}